

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::NotifyEngineAttribute(BP5Writer *this,string name,DataType type)

{
  allocator local_84;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  string local_20;
  
  std::__cxx11::string::string((string *)&local_20,"BP5Writer",&local_81);
  std::__cxx11::string::string((string *)&local_40,"Engine",&local_82);
  std::__cxx11::string::string((string *)&local_60,"ThrowUp",&local_83);
  std::__cxx11::string::string
            ((string *)&local_80,"Engine does not support NotifyEngineAttribute",&local_84);
  helper::Throw<std::invalid_argument>(&local_20,&local_40,&local_60,&local_80,-1);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_20);
  return;
}

Assistant:

void BP5Writer::NotifyEngineAttribute(std::string name, DataType type) noexcept
{
    helper::Throw<std::invalid_argument>("BP5Writer", "Engine", "ThrowUp",
                                         "Engine does not support NotifyEngineAttribute");
}